

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

MethodDefSig * __thiscall
winmd::reader::MemberRef::MethodSignature(MethodDefSig *__return_storage_ptr__,MemberRef *this)

{
  table_base *this_00;
  database *pdVar1;
  byte_view cursor;
  
  this_00 = (this->super_row_base<winmd::reader::MemberRef>).m_table;
  pdVar1 = this_00->m_database;
  table_base::get_value<unsigned_int>
            (this_00,(this->super_row_base<winmd::reader::MemberRef>).m_index,2);
  database::get_blob((database *)&stack0xffffffffffffffd0,(uint32_t)pdVar1);
  MethodDefSig::MethodDefSig
            (__return_storage_ptr__,(this->super_row_base<winmd::reader::MemberRef>).m_table,
             (byte_view *)&stack0xffffffffffffffd0);
  return __return_storage_ptr__;
}

Assistant:

MethodDefSig MethodSignature() const
        {
            auto cursor = get_blob(2);
            return{ get_table(), cursor };
        }